

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-double-page-size.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 extraout_RAX;
  long *plVar5;
  char *pcVar6;
  int extraout_EDX;
  QPDFObjectHandle QVar7;
  QPDF qpdf;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98 [3];
  char *local_80;
  QPDFPageObjectHelper *local_78;
  QPDFPageObjectHelper *local_70;
  undefined1 local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string content;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if ((argc < 2) || (iVar3 = strcmp(argv[1]," --static-id"), iVar3 != 0)) {
    bVar2 = false;
  }
  else {
    argv = argv + 1;
    argc = argc + -1;
    bVar2 = true;
  }
  if (argc - 3U < 2) {
    pcVar6 = argv[1];
    pcVar1 = argv[2];
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&content,"2 0 0 2 0 0 cm\n",(allocator<char> *)&w);
    local_80 = pcVar6;
    QPDF::QPDF(&qpdf);
    QPDF::processFile((char *)&qpdf,pcVar6);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w,&qpdf);
    QPDFPageDocumentHelper::getAllPages();
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w);
    for (; local_78 != local_70; local_78 = local_78 + 0x38) {
      QPDF::newStream((string *)local_60);
      QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60;
      QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_78;
      QPDFPageObjectHelper::addPageContents(QVar7,true);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
      doubleBoxSize(local_78,"/MediaBox");
      doubleBoxSize(local_78,"/CropBox");
      doubleBoxSize(local_78,"/BleedBox");
      doubleBoxSize(local_78,"/TrimBox");
      doubleBoxSize(local_78,"/ArtBox");
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_78);
    QPDFWriter::QPDFWriter(&w,&qpdf,pcVar1);
    if (bVar2) {
      QPDFWriter::setStaticID(SUB81(&w,0));
      QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&w);
    }
    QPDFWriter::write();
    poVar4 = std::operator<<((ostream *)&std::cout,whoami);
    poVar4 = std::operator<<(poVar4,": new file written to ");
    poVar4 = std::operator<<(poVar4,pcVar1);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_98);
    QPDF::~QPDF(&qpdf);
    std::__cxx11::string::~string((string *)&content);
    return 0;
  }
  usage();
  QPDF::~QPDF(&qpdf);
  if (extraout_EDX == 1) {
    plVar5 = (long *)__cxa_begin_catch(extraout_RAX);
    poVar4 = std::operator<<((ostream *)&std::cerr,whoami);
    poVar4 = std::operator<<(poVar4," processing file ");
    poVar4 = std::operator<<(poVar4,local_80);
    poVar4 = std::operator<<(poVar4,": ");
    pcVar6 = (char *)(**(code **)(*plVar5 + 0x10))(plVar5);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    exit(2);
  }
  std::__cxx11::string::~string((string *)&content);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    // For test suite
    bool static_id = false;
    if ((argc > 1) && (strcmp(argv[1], " --static-id") == 0)) {
        static_id = true;
        --argc;
        ++argv;
    }

    if (!((argc == 3) || (argc == 4))) {
        usage();
    }

    char const* infilename = argv[1];
    char const* outfilename = argv[2];
    char const* password = (argc == 4) ? argv[3] : "";

    // Text to prepend to each page's contents
    std::string content = "2 0 0 2 0 0 cm\n";

    try {
        QPDF qpdf;
        qpdf.processFile(infilename, password);

        for (auto& page: QPDFPageDocumentHelper(qpdf).getAllPages()) {
            // Prepend the buffer to the page's contents
            page.addPageContents(qpdf.newStream(content), true);

            // Double the size of each of the content boxes
            doubleBoxSize(page, "/MediaBox");
            doubleBoxSize(page, "/CropBox");
            doubleBoxSize(page, "/BleedBox");
            doubleBoxSize(page, "/TrimBox");
            doubleBoxSize(page, "/ArtBox");
        }

        // Write out a new file
        QPDFWriter w(qpdf, outfilename);
        if (static_id) {
            // For the test suite, uncompress streams and use static IDs.
            w.setStaticID(true); // for testing only
            w.setStreamDataMode(qpdf_s_uncompress);
        }
        w.write();
        std::cout << whoami << ": new file written to " << outfilename << std::endl;
    } catch (std::exception& e) {
        std::cerr << whoami << " processing file " << infilename << ": " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}